

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
::EmplaceDecomposable::operator()
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,any *key,piecewise_construct_t *args,
          tuple<const_cs_impl::any_&> *args_1,tuple<cs::statement_block_*&&> *args_2)

{
  void *this_00;
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  this_00 = *this;
  if (key->mDat == (proxy *)0x0) {
    uVar3 = 0;
  }
  else {
    iVar2 = (*key->mDat->data->_vptr_baseHolder[7])();
    uVar3 = CONCAT44(extraout_var,iVar2);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  emplace_decomposable<cs_impl::any,std::piecewise_construct_t_const&,std::tuple<cs_impl::any_const&>,std::tuple<cs::statement_block*&&>>
            (__return_storage_ptr__,this_00,key,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),args,args_1,args_2);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> operator()(const K& key, Args&&... args) const
				{
					return s.emplace_decomposable(key, s.hash(key), std::forward<Args>(args)...);
				}